

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O3

void __thiscall deqp::gls::LifetimeTests::details::LifeTest::testBind(LifeTest *this)

{
  Type *pTVar1;
  uint uVar2;
  int iVar3;
  deUint32 err;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ResultCollector errors;
  ResultCollector local_38;
  
  local_38.m_testCtx = (this->super_TestBase).super_TestCase.super_TestNode.m_testCtx;
  local_38.m_log = (local_38.m_testCtx)->m_log;
  local_38.m_result = QP_TEST_RESULT_PASS;
  local_38.m_message = "Pass";
  pTVar1 = this->m_type;
  uVar2 = (*pTVar1->_vptr_Type[2])(pTVar1);
  iVar3 = (*this->m_type->_vptr_Type[6])();
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x10))
            ((long *)CONCAT44(extraout_var,iVar3),uVar2);
  iVar3 = (*((this->super_TestBase).m_ctx.m_renderCtx)->_vptr_RenderContext[3])();
  err = (**(code **)(CONCAT44(extraout_var_00,iVar3) + 0x800))();
  glu::checkError(err,"Bind failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
                  ,0x30a);
  iVar3 = (*this->m_type->_vptr_Type[4])(this->m_type,(ulong)uVar2);
  if ((char)iVar3 == '\0') {
    ResultCollector::addResult(&local_38,QP_TEST_RESULT_FAIL,"Object does not exist after binding");
  }
  iVar3 = (*this->m_type->_vptr_Type[6])();
  (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0x10))
            ((long *)CONCAT44(extraout_var_01,iVar3),0);
  (*pTVar1->_vptr_Type[3])(pTVar1,(ulong)uVar2);
  ResultCollector::~ResultCollector(&local_38);
  return;
}

Assistant:

void LifeTest::testBind (void)
{
	ResultCollector	errors	(getTestContext());
	Name			name	(m_type);

	binder().bind(*name);
	GLU_EXPECT_NO_ERROR(gl().getError(), "Bind failed");
	errors.check(m_type.exists(*name), "Object does not exist after binding");
	binder().bind(0);
}